

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O3

void __thiscall QFutureInterfaceBase::cancelChain(QFutureInterfaceBase *this,CancelMode mode)

{
  QBasicMutex *this_00;
  __pointer_type pQVar1;
  QFutureInterfaceBasePrivate *pQVar2;
  QFutureInterfaceBasePrivate *this_01;
  QBasicMutex *this_02;
  bool bVar3;
  
  this_02 = &this->d->continuationMutex;
  if ((this->d->continuationMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar3 = (this_02->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar3) {
      (this_02->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar3) goto LAB_003cd233;
  }
  QBasicMutex::lockInternal(this_02);
LAB_003cd233:
  this_01 = this->d->nonConcludedParent;
  do {
    if (this_01 == (QFutureInterfaceBasePrivate *)0x0) {
      LOCK();
      pQVar1 = (this_02->d_ptr)._q_value._M_b._M_p;
      (this_02->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      if (pQVar1 != (__pointer_type)0x1) {
        QBasicMutex::unlockInternalFutex(this_02,pQVar1);
      }
      QFutureInterfaceBasePrivate::cancelImpl(this->d,mode,(CancelOptions)0x1);
      return;
    }
    QFutureInterfaceBasePrivate::cancelImpl(this_01,mode,(CancelOptions)0x0);
    this_00 = &this_01->continuationMutex;
    if ((this_01->continuationMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
      LOCK();
      bVar3 = (this_00->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
      if (bVar3) {
        (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
      }
      UNLOCK();
      if (!bVar3) goto LAB_003cd270;
    }
    else {
LAB_003cd270:
      QBasicMutex::lockInternal(this_00);
    }
    pQVar2 = this_01->nonConcludedParent;
    LOCK();
    pQVar1 = (this_01->continuationMutex).d_ptr._q_value._M_b._M_p;
    (this_01->continuationMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    this_01 = pQVar2;
    if (pQVar1 != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex(this_00,pQVar1);
    }
  } while( true );
}

Assistant:

void QFutureInterfaceBase::cancelChain(QFutureInterfaceBase::CancelMode mode)
{
    // go up through the list of continuations, cancelling each of them
    {
        QMutexLocker locker(&d->continuationMutex);
        QFutureInterfaceBasePrivate *prev = d->nonConcludedParent;
        while (prev) {
            // Do not cancel continuations, because we're going bottom-to-top
            prev->cancelImpl(mode, QFutureInterfaceBasePrivate::CancelOption::None);
            QMutexLocker prevLocker(&prev->continuationMutex);
            prev = prev->nonConcludedParent;
        }
    }
    // finally, cancel self and all next continuations
    d->cancelImpl(mode, QFutureInterfaceBasePrivate::CancelOption::CancelContinuations);
}